

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::SubroutineIndexMultUniforms::Run(SubroutineIndexMultUniforms *this)

{
  long lVar1;
  UniformValueGenerator *generator;
  LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier> LVar2;
  DefOccurence local_8b4;
  LayoutSpecifierBase local_8b0;
  LayoutSpecifierBase local_8a0;
  SubroutineUniform local_890;
  LayoutSpecifierBase local_728;
  DefOccurence local_714;
  LayoutSpecifierBase local_710;
  LayoutSpecifierBase local_700;
  SubroutineUniform local_6f0;
  undefined1 local_588 [8];
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunction local_540;
  LayoutSpecifierBase local_438;
  LayoutSpecifierBase local_428;
  LayoutSpecifierBase local_418;
  SubroutineFunction local_408;
  undefined1 local_300 [8];
  SubroutineFunctionSet functions_st1;
  SubroutineFunction local_298;
  LayoutSpecifierBase local_190;
  LayoutSpecifierBase local_180;
  LayoutSpecifierBase local_160;
  SubroutineFunction local_150;
  undefined1 local_48 [8];
  SubroutineFunctionSet functions_st0;
  SubroutineIndexMultUniforms *this_local;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  functions_st0.typeName.field_2._8_8_ = this;
  SubroutineFunctionSet::SubroutineFunctionSet((SubroutineFunctionSet *)local_48,generator,0);
  local_190 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(1,Dec);
  local_180 = local_190;
  local_160 = local_190;
  SubroutineFunction::SubroutineFunction(&local_150,generator,(Index)local_190);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_150);
  SubroutineFunction::~SubroutineFunction(&local_150);
  LVar2 = LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(3,Dec);
  functions_st1.typeName.field_2._8_8_ = LVar2.super_LayoutSpecifierBase._0_8_;
  SubroutineFunction::SubroutineFunction
            (&local_298,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (Index)LVar2.super_LayoutSpecifierBase);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_48,&local_298);
  SubroutineFunction::~SubroutineFunction(&local_298);
  SubroutineFunctionSet::SubroutineFunctionSet
            ((SubroutineFunctionSet *)local_300,
             &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,0);
  local_438 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(2,Dec);
  local_428 = local_438;
  local_418 = local_438;
  SubroutineFunction::SubroutineFunction
            (&local_408,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (Index)local_438);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_300,&local_408);
  SubroutineFunction::~SubroutineFunction(&local_408);
  LVar2 = LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::C(0,Dec);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = LVar2.super_LayoutSpecifierBase._0_8_;
  SubroutineFunction::SubroutineFunction
            (&local_540,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (Index)LVar2.super_LayoutSpecifierBase);
  SubroutineFunctionSet::push_back((SubroutineFunctionSet *)local_300,&local_540);
  SubroutineFunction::~SubroutineFunction(&local_540);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
            *)local_588);
  local_710 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(1,Dec);
  local_700 = local_710;
  DefOccurence::DefOccurence(&local_714,FSH_OR_CSH);
  local_728 = local_700;
  SubroutineUniform::SubroutineUniform
            (&local_6f0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)local_48,(Loc)local_700,0,local_714,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_588,&local_6f0);
  SubroutineUniform::~SubroutineUniform(&local_6f0);
  local_8b0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(9,Dec);
  local_8a0 = local_8b0;
  DefOccurence::DefOccurence(&local_8b4,FSH_OR_CSH);
  SubroutineUniform::SubroutineUniform
            (&local_890,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             (SubroutineFunctionSet *)local_300,(Loc)local_8a0,0,local_8b4,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *)local_588,&local_890);
  SubroutineUniform::~SubroutineUniform(&local_890);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      *)local_588);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             *)local_588);
  SubroutineFunctionSet::~SubroutineFunctionSet((SubroutineFunctionSet *)local_300);
  SubroutineFunctionSet::~SubroutineFunctionSet((SubroutineFunctionSet *)local_48);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		//one shader:

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = 1) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(1)));
		//layout(index = 3) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(3)));

		//subroutine vec4 st1(float param);
		SubroutineFunctionSet functions_st1(uniformValueGenerator);
		//layout(index = 2) subroutine(st1) vec4 sf2(float param) { .... };
		functions_st1.push_back(SubroutineFunction(uniformValueGenerator, Index::C(2)));
		//layout(index = 0) subroutine(st1) vec4 sf3(float param) { .... };
		functions_st1.push_back(SubroutineFunction(uniformValueGenerator, Index::C(0)));

		std::vector<SubroutineUniform> subroutineUniforms;
		//layout(location = 1) subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 0, DefOccurence::FSH_OR_CSH));
		//layout(location = 9) subroutine uniform st1 u1;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st1, Loc::C(9), 0, DefOccurence::FSH_OR_CSH));

		return doRun(subroutineUniforms);
	}